

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.h
# Opt level: O3

bool operator==(CTxIn *a,CTxIn *b)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar4[0] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar4[1] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar4[2] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar4[3] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar4[4] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar4[5] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar4[6] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar4[7] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar4[8] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar4[9] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar4[10] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar4[0xb] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar4[0xc] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar4[0xd] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar4[0xe] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar4[0xf] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar3[0] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar3[1] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar3[2] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar3[3] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar3[4] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar3[5] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar3[6] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar3[7] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar3[8] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar3[9] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
               (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar3[10] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar3[0xb] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar3[0xc] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar3[0xd] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar3[0xe] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar3[0xf] = -((b->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 (a->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar3 = auVar3 & auVar4;
  bVar2 = false;
  if (((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) &&
     (bVar2 = false, (a->prevout).n == (b->prevout).n)) {
    bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                      (&(a->scriptSig).super_CScriptBase,&(b->scriptSig).super_CScriptBase);
    if (bVar2) {
      bVar2 = a->nSequence == b->nSequence;
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

constexpr int Compare(const base_blob& other) const { return std::memcmp(m_data.data(), other.m_data.data(), WIDTH); }